

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_import.cpp
# Opt level: O2

void __thiscall
UnitsImport_nonExistentUrl_Test::UnitsImport_nonExistentUrl_Test
          (UnitsImport_nonExistentUrl_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00135ac0;
  return;
}

Assistant:

TEST(UnitsImport, nonExistentUrl)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"http://someplace.world/cellml/model.xml\">\n"
        "    <units units_ref=\"per_mole\" name=\"noble_per_mole\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("http://someplace.world/cellml/model.xml");

    libcellml::UnitsPtr importedUnits = libcellml::Units::create();

    EXPECT_EQ(importedUnits->importSource(), nullptr);

    importedUnits->setName("noble_per_mole");
    importedUnits->setSourceUnits(imp, "per_mole");

    EXPECT_EQ(importedUnits->importSource(), imp);

    EXPECT_EQ(size_t(0), m->unitsCount());
    m->addUnits(importedUnits);
    EXPECT_EQ(size_t(1), m->unitsCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}